

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FSpecialFont::LoadTranslations(FSpecialFont *this)

{
  byte bVar1;
  int iVar2;
  FTexture *pic;
  long *plVar3;
  BYTE *pBVar4;
  int total_colors;
  uint uVar5;
  long lVar6;
  int iVar7;
  FRemapTable *pFVar8;
  long lVar9;
  ulong uVar10;
  double *luminosity;
  BYTE usedcolors [256];
  BYTE identity [256];
  double *local_250;
  undefined1 local_248 [16];
  BYTE local_238 [256];
  byte local_138 [264];
  
  iVar7 = (this->super_FFont).FirstChar;
  iVar2 = (this->super_FFont).LastChar;
  memset(local_238,0,0x100);
  if (iVar7 <= iVar2) {
    uVar10 = (ulong)((iVar2 - iVar7) + 1);
    lVar6 = 0;
    do {
      pic = *(FTexture **)((long)&((this->super_FFont).Chars)->Pic + lVar6);
      if (pic != (FTexture *)0x0) {
        (*pic->_vptr_FTexture[9])(pic);
        pic[1].Scale.X = 0.0;
        RecordTextureColors(pic,local_238);
      }
      lVar6 = lVar6 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  lVar6 = 0;
  do {
    local_248 = *(undefined1 (*) [16])(this->notranslate + lVar6);
    if ((local_248 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_238[lVar6] = '\0';
    }
    uVar5 = local_248._0_4_;
    if ((uVar5 >> 8 & 1) != 0) {
      local_238[lVar6 + 1] = '\0';
    }
    if ((uVar5 >> 0x10 & 1) != 0) {
      local_238[lVar6 + 2] = '\0';
    }
    if ((uVar5 >> 0x18 & 1) != 0) {
      local_238[lVar6 + 3] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_238[lVar6 + 4] = '\0';
    }
    if ((local_248._4_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 5] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_238[lVar6 + 6] = '\0';
    }
    if ((local_248._6_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 7] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_238[lVar6 + 8] = '\0';
    }
    if ((local_248._8_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 9] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_238[lVar6 + 10] = '\0';
    }
    if ((local_248._10_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 0xb] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_238[lVar6 + 0xc] = '\0';
    }
    if ((local_248._12_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 0xd] = '\0';
    }
    if ((local_248 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_238[lVar6 + 0xe] = '\0';
    }
    if ((local_248._14_2_ >> 8 & 1) != 0) {
      local_238[lVar6 + 0xf] = '\0';
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x100);
  total_colors = FFont::SimpleTranslation
                           (local_238,(this->super_FFont).PatchRemap,local_238 + 0x100,&local_250);
  (this->super_FFont).ActiveColors = total_colors;
  lVar6 = 0;
  do {
    if (this->notranslate[lVar6] == true) {
      (this->super_FFont).PatchRemap[lVar6] = (BYTE)total_colors;
      local_238[(long)total_colors + 0x100] = (BYTE)lVar6;
      total_colors = total_colors + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  if (iVar7 <= iVar2) {
    uVar10 = (ulong)((iVar2 - iVar7) + 1);
    lVar6 = 0;
    do {
      plVar3 = *(long **)((long)&((this->super_FFont).Chars)->Pic + lVar6);
      if (plVar3 != (long *)0x0) {
        pBVar4 = (this->super_FFont).PatchRemap;
        (**(code **)(*plVar3 + 0x48))(plVar3);
        plVar3[0xd] = (long)pBVar4;
      }
      lVar6 = lVar6 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  FFont::BuildTranslations
            (&this->super_FFont,local_250,local_238 + 0x100,TranslationParms[0].Array,total_colors,
             (PalEntry *)0x0);
  if (0 < NumTextColors && (this->super_FFont).ActiveColors < total_colors) {
    lVar6 = 0;
    iVar7 = NumTextColors;
    do {
      iVar2 = (this->super_FFont).ActiveColors;
      lVar9 = (long)iVar2;
      if (iVar2 < total_colors) {
        pFVar8 = (this->super_FFont).Ranges.Array + lVar6;
        do {
          bVar1 = local_238[lVar9 + 0x100];
          pFVar8->Remap[lVar9] = bVar1;
          pFVar8->Palette[lVar9].field_0 = GPalette.BaseColors[bVar1].field_0;
          pFVar8->Palette[lVar9].field_0.field_0.a = 0xff;
          lVar9 = lVar9 + 1;
          iVar7 = NumTextColors;
        } while (total_colors != lVar9);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar7);
  }
  (this->super_FFont).ActiveColors = total_colors;
  if (local_250 != (double *)0x0) {
    operator_delete__(local_250);
  }
  return;
}

Assistant:

void FSpecialFont::LoadTranslations()
{
	int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;
	int TotalColors;
	int i, j;

	memset (usedcolors, 0, 256);
	for (i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	// exclude the non-translated colors from the translation calculation
	for (i = 0; i < 256; i++)
		if (notranslate[i])
			usedcolors[i] = false;

	TotalColors = ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	// Map all untranslated colors into the table of used colors
	for (i = 0; i < 256; i++) 
	{
		if (notranslate[i])
		{
			PatchRemap[i] = TotalColors;
			identity[TotalColors] = i;
			TotalColors++;
		}
	}

	for (i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], TotalColors, NULL);

	// add the untranslated colors to the Ranges tables
	if (ActiveColors < TotalColors)
	{
		for (i = 0; i < NumTextColors; i++)
		{
			FRemapTable *remap = &Ranges[i];
			for (j = ActiveColors; j < TotalColors; ++j)
			{
				remap->Remap[j] = identity[j];
				remap->Palette[j] = GPalette.BaseColors[identity[j]];
				remap->Palette[j].a = 0xff;
			}
		}
	}
	ActiveColors = TotalColors;

	delete[] luminosity;
}